

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O2

void __thiscall
Diligent::QueryBase<Diligent::EngineVkImplTraits>::~QueryBase
          (QueryBase<Diligent::EngineVkImplTraits> *this)

{
  char (*in_R8) [64];
  string _msg;
  
  (this->
  super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>).
  super_ObjectBase<Diligent::IQueryVk>.super_RefCountedObject<Diligent::IQueryVk>.super_IQueryVk.
  super_IQuery.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00a56040;
  if (this->m_State == Querying) {
    FormatString<char[19],char_const*,char[64]>
              (&_msg,(Diligent *)"Destroying query \'",
               (char (*) [19])
               &(this->
                super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                ).m_Desc,(char **)"\' that is in querying state. End the query before releasing it."
               ,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  RefCntAutoPtr<Diligent::DeviceContextVkImpl>::Release(&this->m_pContext);
  DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>::
  ~DeviceObjectBase(&this->
                     super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                   );
  return;
}

Assistant:

~QueryBase()
    {
        if (m_State == QueryState::Querying)
        {
            LOG_ERROR_MESSAGE("Destroying query '", this->m_Desc.Name,
                              "' that is in querying state. End the query before releasing it.");
        }
    }